

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.h
# Opt level: O2

void __thiscall
iDynTree::Triplets::addSubMatrix<(iDynTree::MatrixStorageOrdering)0>
          (Triplets *this,size_t startingRow,size_t startingColumn,
          SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *matrix)

{
  pointer pTVar1;
  pointer pTVar2;
  size_t sVar3;
  const_iterator it;
  const_iterator it_1;
  
  pTVar1 = (this->m_triplets).
           super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2 = (this->m_triplets).
           super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = VectorDynSize::size(&matrix->m_values);
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
            (&this->m_triplets,((long)pTVar1 - (long)pTVar2) / 0x18 + sVar3);
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::ConstIterator(&it,matrix,true);
  while( true ) {
    SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::ConstIterator
              (&it_1,matrix,false);
    if ((it.m_matrix == it_1.m_matrix) && (it.m_index == -1)) break;
    Triplet::Triplet((Triplet *)&it_1,it.m_currentTriplet.row + startingRow,
                     it.m_currentTriplet.column + startingColumn,it.m_currentTriplet.value);
    std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
    emplace_back<iDynTree::Triplet>(&this->m_triplets,(Triplet *)&it_1);
    SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::operator++(&it);
  }
  return;
}

Assistant:

void addSubMatrix(std::size_t startingRow,
                      std::size_t startingColumn,
                      const SparseMatrix<ordering>& matrix)
    {
        //if enough memory has been reserved this should be a noop
        m_triplets.reserve(m_triplets.size() + matrix.numberOfNonZeros());

        for (typename SparseMatrix<ordering>::const_iterator it(matrix.begin());
             it != matrix.end(); ++it) {
            m_triplets.push_back(Triplet(startingRow + it->row,
                                         startingColumn + it->column,
                                         it->value));
        }
    }